

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *printer)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  cpp *this_00;
  size_type sVar5;
  bool bVar6;
  mapped_type *pmVar7;
  Options *options;
  Options *pOVar8;
  Descriptor *descriptor;
  int offset;
  int iVar9;
  _Alloc_hider _Var10;
  long lVar11;
  int i;
  ulong uVar12;
  ulong uVar13;
  int num_deps;
  allocator local_2e2;
  allocator local_2e1;
  Options *local_2e0;
  Formatter format;
  string local_2a0;
  string local_280;
  int local_25c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_258;
  char *local_250;
  string protodef_name;
  string file_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  unsigned_long local_1e0;
  size_type local_1d8;
  key_type local_1d0;
  CrossFileReferences refs;
  FileDescriptorProto file_proto;
  
  local_258 = &this->variables_;
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&local_258->_M_t);
  puVar1 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    file_proto.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)((long)puVar2 - (long)puVar1 >> 3);
    Formatter::operator()
              (&format,"static ::$proto_ns$::Metadata $file_level_metadata$[$1$];\n",
               (unsigned_long *)&file_proto);
  }
  puVar3 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 == puVar4) {
    Formatter::operator()<>
              (&format,
               "static constexpr ::$proto_ns$::EnumDescriptor const** $file_level_enum_descriptors$ = nullptr;\n"
              );
  }
  else {
    file_proto.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)((long)puVar4 - (long)puVar3 >> 3);
    Formatter::operator()
              (&format,
               "static const ::$proto_ns$::EnumDescriptor* $file_level_enum_descriptors$[$1$];\n",
               (unsigned_long *)&file_proto);
  }
  local_2e0 = &this->options_;
  bVar6 = HasGenericServices(this->file_,local_2e0);
  if ((bVar6) && (0 < *(int *)(this->file_ + 0x34))) {
    file_proto.super_Message.super_MessageLite._vptr_MessageLite._0_4_ =
         *(int *)(this->file_ + 0x34);
    Formatter::operator()
              (&format,
               "static const ::$proto_ns$::ServiceDescriptor* $file_level_service_descriptors$[$1$];\n"
               ,(int *)&file_proto);
  }
  else {
    Formatter::operator()<>
              (&format,
               "static constexpr ::$proto_ns$::ServiceDescriptor const** $file_level_service_descriptors$ = nullptr;\n"
              );
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Formatter::operator()<>
              (&format,
               "const $uint32$ $tablename$::offsets[1] = {};\nstatic constexpr ::$proto_ns$::internal::MigrationSchema* schemas = nullptr;\nstatic constexpr ::$proto_ns$::Message* const* file_default_instances = nullptr;\n\n"
              );
  }
  else {
    Formatter::operator()<>
              (&format,
               "\nconst $uint32$ $tablename$::offsets[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(format.printer_);
    protodef_name._M_dataplus._M_p = (pointer)0x0;
    protodef_name._M_string_length = 0;
    protodef_name.field_2._M_allocated_capacity = 0;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)&protodef_name,
              (long)(this->message_generators_).
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->message_generators_).
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    for (uVar12 = 0;
        puVar1 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar12 < (ulong)((long)(this->message_generators_).
                               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar12 = uVar12 + 1) {
      file_proto.super_Message.super_MessageLite =
           (MessageLite)
           MessageGenerator::GenerateOffsets
                     ((MessageGenerator *)
                      puVar1[uVar12]._M_t.
                      super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                      ._M_t,printer);
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&protodef_name,(pair<unsigned_long,_unsigned_long> *)&file_proto);
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>
              (&format,
               "};\nstatic const ::$proto_ns$::internal::MigrationSchema schemas[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(format.printer_);
    lVar11 = 0;
    iVar9 = 0;
    for (uVar12 = 0;
        puVar1 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar12 < (ulong)((long)(this->message_generators_).
                               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar12 = uVar12 + 1) {
      MessageGenerator::GenerateSchema
                ((MessageGenerator *)
                 puVar1[uVar12]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ._M_t,printer,iVar9,*(int *)(protodef_name._M_dataplus._M_p + lVar11 + 8));
      iVar9 = iVar9 + *(int *)(protodef_name._M_dataplus._M_p + lVar11);
      lVar11 = lVar11 + 0x10;
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>
              (&format,
               "};\n\nstatic ::$proto_ns$::Message const * const file_default_instances[] = {\n");
    io::Printer::Indent(format.printer_);
    pOVar8 = (Options *)0x0;
    while( true ) {
      puVar1 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      options = (Options *)
                ((long)(this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      if (options <= pOVar8) break;
      this_00 = *(cpp **)puVar1[(long)pOVar8]._M_t.
                         super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         ._M_t;
      Namespace_abi_cxx11_((string *)&file_proto,this_00,(Descriptor *)local_2e0,options);
      ClassName_abi_cxx11_((string *)&refs,this_00,descriptor);
      Formatter::operator()
                (&format,
                 "reinterpret_cast<const ::$proto_ns$::Message*>(&$1$::_$2$_default_instance_),\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_proto,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refs);
      std::__cxx11::string::~string((string *)&refs);
      std::__cxx11::string::~string((string *)&file_proto);
      pOVar8 = (Options *)((long)&(pOVar8->dllexport_decl)._M_dataplus._M_p + 1);
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"};\n\n");
    std::
    _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)&protodef_name);
  }
  std::__cxx11::string::string((string *)&file_proto,"descriptor_table_protodef",(allocator *)&refs)
  ;
  UniqueName(&protodef_name,(string *)&file_proto,this->file_,local_2e0);
  std::__cxx11::string::~string((string *)&file_proto);
  Formatter::operator()
            (&format,"const char $1$[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) =\n",&protodef_name
            );
  io::Printer::Indent(format.printer_);
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  FileDescriptor::CopyTo(this->file_,&file_proto);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&file_proto,&file_data);
  if (file_data._M_string_length < 0x10000) {
    for (uVar12 = 0; uVar12 < file_data._M_string_length; uVar12 = uVar12 + 0x28) {
      std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&file_data);
      CEscape(&local_280,&local_2a0);
      EscapeTrigraphs((string *)&refs,&local_280);
      Formatter::operator()
                (&format,"\"$1$\"\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refs);
      std::__cxx11::string::~string((string *)&refs);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
  }
  else {
    Formatter::operator()<>(&format,"{ ");
    iVar9 = 0;
    while (uVar12 = (ulong)iVar9, uVar12 < file_data._M_string_length) {
      local_25c = iVar9 + 0x19;
      uVar13 = (ulong)local_25c;
      for (; iVar9 = local_25c, uVar13 != uVar12; uVar12 = uVar12 + 1) {
        if (file_data._M_string_length <= uVar12) {
          iVar9 = (int)uVar12;
          break;
        }
        std::__cxx11::string::substr((ulong)&local_280,(ulong)&file_data);
        CEscape((string *)&refs,&local_280);
        Formatter::operator()
                  (&format,"\'$1$\', ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refs);
        std::__cxx11::string::~string((string *)&refs);
        std::__cxx11::string::~string((string *)&local_280);
      }
      Formatter::operator()<>(&format,"\n");
    }
    Formatter::operator()<>(&format,"\'\\0\' }");
  }
  Formatter::operator()<>(&format,";\n");
  io::Printer::Outdent(format.printer_);
  refs.weak_default_instances._M_h._M_buckets = &refs.weak_default_instances._M_h._M_single_bucket;
  pOVar8 = (Options *)0x1;
  refs.weak_default_instances._M_h._M_bucket_count = 1;
  refs.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_default_instances._M_h._M_element_count = 0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_default_instances._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.strong_reflection_files._M_h._M_buckets = &refs.strong_reflection_files._M_h._M_single_bucket
  ;
  refs.strong_reflection_files._M_h._M_bucket_count = 1;
  refs.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.strong_reflection_files._M_h._M_element_count = 0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.strong_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  refs.weak_reflection_files._M_h._M_buckets = &refs.weak_reflection_files._M_h._M_single_bucket;
  refs.weak_reflection_files._M_h._M_bucket_count = 1;
  refs.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  refs.weak_reflection_files._M_h._M_element_count = 0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  refs.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  refs.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GetCrossFileReferencesForFile(this,this->file_,&refs);
  num_deps = (int)refs.weak_reflection_files._M_h._M_element_count +
             (int)refs.strong_reflection_files._M_h._M_element_count;
  if (0 < num_deps) {
    Formatter::operator()
              (&format,
               "static const ::$proto_ns$::internal::DescriptorTable*const $desc_table$_deps[$1$] = {\n"
               ,&num_deps);
    anon_unknown_57::Sorted<google::protobuf::FileDescriptor>
              ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&local_2a0,&refs.strong_reflection_files);
    sVar5 = local_2a0._M_string_length;
    for (_Var10._M_p = local_2a0._M_dataplus._M_p; _Var10._M_p != (pointer)sVar5;
        _Var10._M_p = _Var10._M_p + 8) {
      DescriptorTableName_abi_cxx11_
                (&local_280,*(cpp **)_Var10._M_p,(FileDescriptor *)local_2e0,pOVar8);
      Formatter::operator()(&format,"  &::$1$,\n",&local_280);
      std::__cxx11::string::~string((string *)&local_280);
    }
    std::
    _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)&local_2a0);
    anon_unknown_57::Sorted<google::protobuf::FileDescriptor>
              ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&local_2a0,&refs.weak_reflection_files);
    for (; local_2a0._M_dataplus._M_p != (pointer)local_2a0._M_string_length;
        local_2a0._M_dataplus._M_p = local_2a0._M_dataplus._M_p + 8) {
      DescriptorTableName_abi_cxx11_
                (&local_280,*(cpp **)local_2a0._M_dataplus._M_p,(FileDescriptor *)local_2e0,pOVar8);
      Formatter::operator()(&format,"  &::$1$,\n",&local_280);
      std::__cxx11::string::~string((string *)&local_280);
    }
    std::
    _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)&local_2a0);
    Formatter::operator()<>(&format,"};\n");
  }
  iVar9 = num_deps;
  local_250 = "false";
  local_1d8 = file_data._M_string_length;
  if (num_deps == 0) {
    std::__cxx11::string::string((string *)&local_280,"nullptr",(allocator *)&local_2a0);
  }
  else {
    std::__cxx11::string::string((string *)&local_2a0,"desc_table",&local_2e1);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_258,&local_2a0);
    std::operator+(&local_280,pmVar7,"_deps");
  }
  puVar1 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1e0 = (long)puVar2 - (long)puVar1 >> 3;
  if (puVar2 == puVar1) {
    std::__cxx11::string::string((string *)&local_200,"nullptr",(allocator *)&local_1d0);
  }
  else {
    std::__cxx11::string::string((string *)&local_1d0,"file_level_metadata",&local_2e2);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_258,&local_1d0);
    std::__cxx11::string::string((string *)&local_200,(string *)pmVar7);
  }
  Formatter::operator()
            (&format,
             "static ::$proto_ns$::internal::once_flag $desc_table$_once;\nconst ::$proto_ns$::internal::DescriptorTable $desc_table$ = {\n  false, $1$, $2$, $3$, \"$filename$\", \n  &$desc_table$_once, $4$, $5$, $6$,\n  schemas, file_default_instances, $tablename$::offsets,\n  $7$, $file_level_enum_descriptors$, $file_level_service_descriptors$,\n};\nPROTOBUF_ATTRIBUTE_WEAK const ::$proto_ns$::internal::DescriptorTable* $desc_table$_getter() {\n  return &$desc_table$;\n}\n\n"
             ,&local_250,&local_1d8,&protodef_name,&local_280,&num_deps,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  if (puVar1 != puVar2) {
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::__cxx11::string::~string((string *)&local_280);
  if (iVar9 != 0) {
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  bVar6 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           this->file_,"net/proto2/proto/descriptor.proto");
  if (bVar6) {
    std::__cxx11::string::string((string *)&local_200,"dynamic_init_dummy",(allocator *)&local_250);
    UniqueName(&local_280,&local_200,this->file_,local_2e0);
    Formatter::operator()
              (&format,
               "// Force running AddDescriptors() at dynamic initialization time.\nPROTOBUF_ATTRIBUTE_INIT_PRIORITY static ::$proto_ns$::internal::AddDescriptorsRunner $1$(&$desc_table$);\n"
               ,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_200);
  }
  CrossFileReferences::~CrossFileReferences(&refs);
  std::__cxx11::string::~string((string *)&file_data);
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  std::__cxx11::string::~string((string *)&protodef_name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* printer) {
  Formatter format(printer, variables_);

  if (!message_generators_.empty()) {
    format("static ::$proto_ns$::Metadata $file_level_metadata$[$1$];\n",
           message_generators_.size());
  }
  if (!enum_generators_.empty()) {
    format(
        "static "
        "const ::$proto_ns$::EnumDescriptor* "
        "$file_level_enum_descriptors$[$1$];\n",
        enum_generators_.size());
  } else {
    format(
        "static "
        "constexpr ::$proto_ns$::EnumDescriptor const** "
        "$file_level_enum_descriptors$ = nullptr;\n");
  }
  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    format(
        "static "
        "const ::$proto_ns$::ServiceDescriptor* "
        "$file_level_service_descriptors$[$1$];\n",
        file_->service_count());
  } else {
    format(
        "static "
        "constexpr ::$proto_ns$::ServiceDescriptor const** "
        "$file_level_service_descriptors$ = nullptr;\n");
  }

  if (!message_generators_.empty()) {
    format(
        "\n"
        "const $uint32$ $tablename$::offsets[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();
    std::vector<std::pair<size_t, size_t> > pairs;
    pairs.reserve(message_generators_.size());
    for (int i = 0; i < message_generators_.size(); i++) {
      pairs.push_back(message_generators_[i]->GenerateOffsets(printer));
    }
    format.Outdent();
    format(
        "};\n"
        "static const ::$proto_ns$::internal::MigrationSchema schemas[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();
    {
      int offset = 0;
      for (int i = 0; i < message_generators_.size(); i++) {
        message_generators_[i]->GenerateSchema(printer, offset,
                                               pairs[i].second);
        offset += pairs[i].first;
      }
    }
    format.Outdent();
    format(
        "};\n"
        "\nstatic "
        "::$proto_ns$::Message const * const file_default_instances[] = {\n");
    format.Indent();
    for (int i = 0; i < message_generators_.size(); i++) {
      const Descriptor* descriptor = message_generators_[i]->descriptor_;
      format(
          "reinterpret_cast<const "
          "::$proto_ns$::Message*>(&$1$::_$2$_default_instance_),\n",
          Namespace(descriptor, options_),  // 1
          ClassName(descriptor));           // 2
    }
    format.Outdent();
    format(
        "};\n"
        "\n");
  } else {
    // we still need these symbols to exist
    format(
        // MSVC doesn't like empty arrays, so we add a dummy.
        "const $uint32$ $tablename$::offsets[1] = {};\n"
        "static constexpr ::$proto_ns$::internal::MigrationSchema* schemas = "
        "nullptr;"
        "\n"
        "static constexpr ::$proto_ns$::Message* const* "
        "file_default_instances = nullptr;\n"
        "\n");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.
  const std::string protodef_name =
      UniqueName("descriptor_table_protodef", file_, options_);
  format("const char $1$[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) =\n",
         protodef_name);
  format.Indent();
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  {
    if (file_data.size() > 65535) {
      // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
      // 65535 bytes in length". Declare a static array of chars rather than
      // use a string literal. Only write 25 bytes per line.
      static const int kBytesPerLine = 25;
      format("{ ");
      for (int i = 0; i < file_data.size();) {
        for (int j = 0; j < kBytesPerLine && i < file_data.size(); ++i, ++j) {
          format("'$1$', ", CEscape(file_data.substr(i, 1)));
        }
        format("\n");
      }
      format("'\\0' }");  // null-terminate
    } else {
      // Only write 40 bytes per line.
      static const int kBytesPerLine = 40;
      for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
        format(
            "\"$1$\"\n",
            EscapeTrigraphs(CEscape(file_data.substr(i, kBytesPerLine))));
      }
    }
    format(";\n");
  }
  format.Outdent();

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  int num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    format(
        "static const ::$proto_ns$::internal::DescriptorTable*const "
        "$desc_table$_deps[$1$] = {\n",
        num_deps);

    for (auto dep : Sorted(refs.strong_reflection_files)) {
      format("  &::$1$,\n", DescriptorTableName(dep, options_));
    }
    for (auto dep : Sorted(refs.weak_reflection_files)) {
      format("  &::$1$,\n", DescriptorTableName(dep, options_));
    }

    format("};\n");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  format(
      "static ::$proto_ns$::internal::once_flag $desc_table$_once;\n"
      "const ::$proto_ns$::internal::DescriptorTable $desc_table$ = {\n"
      "  false, $1$, $2$, $3$, \"$filename$\", \n"
      "  &$desc_table$_once, $4$, $5$, $6$,\n"
      "  schemas, file_default_instances, $tablename$::offsets,\n"
      "  $7$, $file_level_enum_descriptors$, "
      "$file_level_service_descriptors$,\n"
      "};\n"
      // This function exists to be marked as weak.
      // It can significantly speed up compilation by breaking up LLVM's SCC in
      // the .pb.cc translation units. Large translation units see a reduction
      // of more than 35% of walltime for optimized builds.
      // Without the weak attribute all the messages in the file, including all
      // the vtables and everything they use become part of the same SCC through
      // a cycle like:
      // GetMetadata -> descriptor table -> default instances ->
      //   vtables -> GetMetadata
      // By adding a weak function here we break the connection from the
      // individual vtables back into the descriptor table.
      "PROTOBUF_ATTRIBUTE_WEAK const ::$proto_ns$::internal::DescriptorTable* "
      "$desc_table$_getter() {\n"
      "  return &$desc_table$;\n"
      "}\n"
      "\n",
      eager ? "true" : "false", file_data.size(), protodef_name,
      num_deps == 0 ? "nullptr" : variables_["desc_table"] + "_deps", num_deps,
      message_generators_.size(),
      message_generators_.empty() ? "nullptr"
                                  : variables_["file_level_metadata"]);

  // For descriptor.proto we want to avoid doing any dynamic initialization,
  // because in some situations that would otherwise pull in a lot of
  // unnecessary code that can't be stripped by --gc-sections. Descriptor
  // initialization will still be performed lazily when it's needed.
  if (file_->name() != "net/proto2/proto/descriptor.proto") {
    format(
        "// Force running AddDescriptors() at dynamic initialization time.\n"
        "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
        "static ::$proto_ns$::internal::AddDescriptorsRunner "
        "$1$(&$desc_table$);\n",
        UniqueName("dynamic_init_dummy", file_, options_));
  }
}